

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O0

tuple<int> __thiscall
testinator::Arbitrary<std::tuple<int>_>::generate
          (Arbitrary<std::tuple<int>_> *this,size_t n,unsigned_long randomSeed)

{
  undefined1 local_35;
  int local_34;
  unsigned_long local_30;
  result_type r2;
  unsigned_long r1;
  unsigned_long randomSeed_local;
  size_t n_local;
  
  r2 = randomSeed;
  r1 = randomSeed;
  randomSeed_local = n;
  n_local = (size_t)this;
  local_30 = anon_unknown_124::nextRandom(randomSeed);
  local_34 = detail::Arbitrary_Arithmetic<int>::generate(randomSeed_local,r2);
  Arbitrary<std::tuple<>_>::generate(randomSeed_local,local_30);
  tuple_cons<int,std::tuple<>>((int *)this,(tuple<> *)&local_34,&local_35);
  return (tuple<int>)SUB84(this,0);
}

Assistant:

static std::tuple<Ts...> generate(std::size_t n, unsigned long int randomSeed)
    {
      auto r1 = randomSeed;
      auto r2 = nextRandom(r1);

      using H = std::tuple_element_t<0, std::tuple<Ts...>>;
      using T = decltype(tuple_tail(std::declval<std::tuple<Ts...>>()));
      return tuple_cons(Arbitrary<H>::generate(n, r1),
                        Arbitrary<T>::generate(n, r2));
    }